

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Menu_.cxx
# Opt level: O1

void __thiscall Fl_Menu_Item::setonly(Fl_Menu_Item *this)

{
  uint *puVar1;
  uint uVar2;
  int *piVar3;
  
  uVar2 = this->flags;
  this->flags = uVar2 | 0xc;
  if (-1 < (char)uVar2) {
    piVar3 = &this[1].flags;
    do {
      if (((Fl_Menu_Item *)(piVar3 + -8))->text == (char *)0x0) break;
      uVar2 = *piVar3;
      if ((uVar2 & 8) == 0) break;
      *piVar3 = uVar2 & 0xfffffffb;
      piVar3 = piVar3 + 0xe;
    } while (-1 < (char)uVar2);
  }
  if (this[-1].text != (char *)0x0) {
    piVar3 = &this[-1].flags;
    do {
      if ((*piVar3 & 0x80) != 0) {
        return;
      }
      if ((*piVar3 & 8U) == 0) {
        return;
      }
      *piVar3 = *piVar3 & 0xfffffffb;
      puVar1 = (uint *)(piVar3 + -0x16);
      piVar3 = piVar3 + -0xe;
    } while (*(long *)puVar1 != 0);
  }
  return;
}

Assistant:

void Fl_Menu_Item::setonly() {
  flags |= FL_MENU_RADIO | FL_MENU_VALUE;
  Fl_Menu_Item* j;
  for (j = this; ; ) {	// go down
    if (j->flags & FL_MENU_DIVIDER) break; // stop on divider lines
    j++;
    if (!j->text || !j->radio()) break; // stop after group
    j->clear();
  }
  for (j = this-1; ; j--) { // go up
    if (!j->text || (j->flags&FL_MENU_DIVIDER) || !j->radio()) break;
    j->clear();
  }
}